

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O1

void __thiscall QOpenGLTexture::borderColor(QOpenGLTexture *this,float *border)

{
  QOpenGLTexturePrivate *pQVar1;
  long lVar2;
  float fVar3;
  
  pQVar1 = (this->d_ptr).d;
  if ((pQVar1->borderColor).d.size == 0) {
    border[0] = 0.0;
    border[1] = 0.0;
    border[2] = 0.0;
    border[3] = 0.0;
  }
  else {
    lVar2 = 0;
    do {
      fVar3 = (float)QVariant::toFloat((bool *)((long)&(((pQVar1->borderColor).d.ptr)->d).data +
                                               lVar2));
      *border = fVar3;
      border = border + 1;
      lVar2 = lVar2 + 0x20;
    } while (lVar2 != 0x80);
  }
  return;
}

Assistant:

void QOpenGLTexture::borderColor(float *border) const
{
    Q_D(const QOpenGLTexture);
    Q_ASSERT(border);
    if (d->borderColor.isEmpty()) {
        for (int i = 0; i < 4; ++i)
            border[i] = 0.0f;
    } else {
        for (int i = 0; i < 4; ++i)
            border[i] = d->borderColor.at(i).toFloat();
    }
}